

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void __thiscall
ImPlot::GetterHeatmap<float>::GetterHeatmap
          (GetterHeatmap<float> *this,float *values,int rows,int cols,double scale_min,
          double scale_max,double width,double height,double xref,double yref,double ydir)

{
  double ydir_local;
  double yref_local;
  double xref_local;
  double height_local;
  double width_local;
  double scale_max_local;
  double scale_min_local;
  int cols_local;
  int rows_local;
  float *values_local;
  GetterHeatmap<float> *this_local;
  
  this->Values = values;
  this->Count = rows * cols;
  this->Rows = rows;
  this->Cols = cols;
  this->ScaleMin = scale_min;
  this->ScaleMax = scale_max;
  this->Width = width;
  this->Height = height;
  this->XRef = xref;
  this->YRef = yref;
  this->YDir = ydir;
  ImPlotPoint::ImPlotPoint(&this->HalfSize,this->Width * 0.5,this->Height * 0.5);
  return;
}

Assistant:

GetterHeatmap(const T* values, int rows, int cols, double scale_min, double scale_max, double width, double height, double xref, double yref, double ydir) :
        Values(values),
        Count(rows*cols),
        Rows(rows),
        Cols(cols),
        ScaleMin(scale_min),
        ScaleMax(scale_max),
        Width(width),
        Height(height),
        XRef(xref),
        YRef(yref),
        YDir(ydir),
        HalfSize(Width*0.5, Height*0.5)
    { }